

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O0

shared_ptr<mnf::Manifold> __thiscall mnf::CartesianProduct::getNewCopy_(CartesianProduct *this)

{
  CartesianProduct *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CartesianProduct *in_RSI;
  shared_ptr<mnf::Manifold> sVar1;
  undefined1 local_28 [8];
  shared_ptr<mnf::CartesianProduct> copy;
  CartesianProduct *this_local;
  
  this_00 = (CartesianProduct *)operator_new(0xa0);
  CartesianProduct(this_00,in_RSI);
  std::shared_ptr<mnf::CartesianProduct>::shared_ptr<mnf::CartesianProduct,void>
            ((shared_ptr<mnf::CartesianProduct> *)local_28,this_00);
  std::shared_ptr<mnf::Manifold>::shared_ptr<mnf::CartesianProduct,void>
            ((shared_ptr<mnf::Manifold> *)this,(shared_ptr<mnf::CartesianProduct> *)local_28);
  std::shared_ptr<mnf::CartesianProduct>::~shared_ptr((shared_ptr<mnf::CartesianProduct> *)local_28)
  ;
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Manifold
  ;
  return (shared_ptr<mnf::Manifold>)
         sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Manifold> CartesianProduct::getNewCopy_() const
{
  std::shared_ptr<CartesianProduct> copy(new CartesianProduct(*this));
  return copy;
}